

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TmpFile.h
# Opt level: O2

void __thiscall TmpFile::TmpFile(TmpFile *this)

{
  ostream *poVar1;
  int i;
  int iVar2;
  ofstream file;
  
  generateTmpname_abi_cxx11_();
  std::ofstream::ofstream(&file,(string *)this,_S_out);
  for (iVar2 = 0; iVar2 != 1000; iVar2 = iVar2 + 1) {
    poVar1 = std::operator<<((ostream *)&file,"This is line #");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,iVar2);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::ofstream::~ofstream(&file);
  return;
}

Assistant:

TmpFile() {
        std::ofstream file(name_);
        for(int i = 0; i < 1000; i++) {
            file << "This is line #" << i << std::endl;
        }
    }